

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadTagSection(BinaryReader *this,Offset section_size)

{
  bool bVar1;
  Result RVar2;
  uint local_3c;
  uint local_38;
  Index sig_index;
  Index tag_index;
  Index i;
  uint local_28;
  Enum local_24;
  Index num_tags;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _num_tags = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd3])(this->delegate_,section_size);
  bVar1 = Succeeded((Result)local_24);
  if (bVar1) {
    i = (Index)ReadCount(this,&local_28,"tag count");
    bVar1 = Failed((Result)i);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      tag_index = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd4])();
      bVar1 = Succeeded((Result)tag_index);
      if (bVar1) {
        for (sig_index = 0; sig_index < local_28; sig_index = sig_index + 1) {
          local_38 = this->num_tag_imports_ + sig_index;
          RVar2 = ReadTagType(this,&local_3c);
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd5])
                                  (this->delegate_,(ulong)local_38,(ulong)local_3c);
          bVar1 = Succeeded(RVar2);
          if (!bVar1) {
            PrintError(this,"OnTagType callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd6])();
        bVar1 = Succeeded(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
        else {
          PrintError(this,"EndTagSection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"OnTagCount callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginTagSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadTagSection(Offset section_size) {
  CALLBACK(BeginTagSection, section_size);
  Index num_tags;
  CHECK_RESULT(ReadCount(&num_tags, "tag count"));
  CALLBACK(OnTagCount, num_tags);

  for (Index i = 0; i < num_tags; ++i) {
    Index tag_index = num_tag_imports_ + i;
    Index sig_index;
    CHECK_RESULT(ReadTagType(&sig_index));
    CALLBACK(OnTagType, tag_index, sig_index);
  }

  CALLBACK(EndTagSection);
  return Result::Ok;
}